

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O0

UBool uloc_isRightToLeft_63(char *locale)

{
  UBool UVar1;
  int32_t iVar2;
  UScriptCode script_00;
  char *pcVar3;
  char local_e8 [4];
  UScriptCode scriptCode;
  char likely [157];
  char *langPtr;
  char local_30 [4];
  int32_t langLength;
  char lang [8];
  int32_t scriptLength;
  char script [8];
  UErrorCode errorCode;
  char *locale_local;
  
  script[0] = '\0';
  script[1] = '\0';
  script[2] = '\0';
  script[3] = '\0';
  unique0x10000179 = locale;
  lang._0_4_ = uloc_getScript_63(locale,lang + 4,8,(UErrorCode *)script);
  UVar1 = U_FAILURE(script._0_4_);
  if (((UVar1 != '\0') || (script._0_4_ == -0x7c)) || (lang._0_4_ == 0)) {
    script[0] = '\0';
    script[1] = '\0';
    script[2] = '\0';
    script[3] = '\0';
    iVar2 = uloc_getLanguage_63(stack0xffffffffffffffe8,local_30,8,(UErrorCode *)script);
    UVar1 = U_FAILURE(script._0_4_);
    if (((UVar1 != '\0') || (script._0_4_ == -0x7c)) || (iVar2 == 0)) {
      return '\0';
    }
    pcVar3 = strstr("root-en-es-pt-zh-ja-ko-de-fr-it-ar+he+fa+ru-nl-pl-th-tr-",local_30);
    if (pcVar3 != (char *)0x0) {
      if (pcVar3[iVar2] == '+') {
        return '\x01';
      }
      if (pcVar3[iVar2] == '-') {
        return '\0';
      }
    }
    script[0] = '\0';
    script[1] = '\0';
    script[2] = '\0';
    script[3] = '\0';
    uloc_addLikelySubtags_63(stack0xffffffffffffffe8,local_e8,0x9d,(UErrorCode *)script);
    UVar1 = U_FAILURE(script._0_4_);
    if ((UVar1 != '\0') || (script._0_4_ == -0x7c)) {
      return '\0';
    }
    lang._0_4_ = uloc_getScript_63(local_e8,lang + 4,8,(UErrorCode *)script);
    UVar1 = U_FAILURE(script._0_4_);
    if (((UVar1 != '\0') || (script._0_4_ == -0x7c)) || (lang._0_4_ == 0)) {
      return '\0';
    }
  }
  script_00 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,lang + 4);
  UVar1 = uscript_isRightToLeft_63(script_00);
  return UVar1;
}

Assistant:

U_CAPI UBool U_EXPORT2
uloc_isRightToLeft(const char *locale) {
    UErrorCode errorCode = U_ZERO_ERROR;
    char script[8];
    int32_t scriptLength = uloc_getScript(locale, script, UPRV_LENGTHOF(script), &errorCode);
    if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING ||
            scriptLength == 0) {
        // Fastpath: We know the likely scripts and their writing direction
        // for some common languages.
        errorCode = U_ZERO_ERROR;
        char lang[8];
        int32_t langLength = uloc_getLanguage(locale, lang, UPRV_LENGTHOF(lang), &errorCode);
        if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING ||
                langLength == 0) {
            return FALSE;
        }
        const char* langPtr = uprv_strstr(LANG_DIR_STRING, lang);
        if (langPtr != NULL) {
            switch (langPtr[langLength]) {
            case '-': return FALSE;
            case '+': return TRUE;
            default: break;  // partial match of a longer code
            }
        }
        // Otherwise, find the likely script.
        errorCode = U_ZERO_ERROR;
        char likely[ULOC_FULLNAME_CAPACITY];
        (void)uloc_addLikelySubtags(locale, likely, UPRV_LENGTHOF(likely), &errorCode);
        if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING) {
            return FALSE;
        }
        scriptLength = uloc_getScript(likely, script, UPRV_LENGTHOF(script), &errorCode);
        if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING ||
                scriptLength == 0) {
            return FALSE;
        }
    }
    UScriptCode scriptCode = (UScriptCode)u_getPropertyValueEnum(UCHAR_SCRIPT, script);
    return uscript_isRightToLeft(scriptCode);
}